

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_ssim_test.cc
# Opt level: O0

void __thiscall (anonymous_namespace)::EndToEndSSIMTest::PreEncodeFrameHook(EndToEndSSIMTest *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  EndToEndSSIMTest *in_stack_00000020;
  
  anon_unknown.dwarf_11879c7::EndToEndSSIMTest::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 4);
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AOME_SET_TUNING, AOM_TUNE_SSIM);
      encoder->Control(AOME_SET_CQ_LEVEL, kCqLevel);
    }
  }